

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_spanel_dfs.c
# Opt level: O0

void ilu_spanel_dfs(int m,int w,int jcol,SuperMatrix *A,int *perm_r,int *nseg,float *dense,
                   float *amax,int *panel_lsub,int *segrep,int *repfnz,int *marker,int *parent,
                   int_t *xplore,GlobalLU_t *Glu)

{
  int iVar1;
  float fVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  int_t *piVar10;
  int_t *piVar11;
  int iVar12;
  double tmp;
  float *amax_col;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  float *pfStack_b0;
  int_t nextl_col;
  float *dense_col;
  int *repfnz_col;
  int *marker1;
  int local_90;
  int jj;
  int_t k;
  int_t maxdfs;
  int_t xdfs;
  int kpar;
  int kperm;
  int kmark;
  int krow;
  int myfnz;
  int kchild;
  int oldrep;
  int chrep;
  int chmark;
  int chperm;
  int krep;
  int_t *xa_end;
  int_t *xa_begin;
  int_t *asub;
  float *a;
  NCPformat *Astore;
  int *nseg_local;
  int *perm_r_local;
  SuperMatrix *A_local;
  int jcol_local;
  int w_local;
  int m_local;
  
  pvVar3 = A->Store;
  lVar4 = *(long *)((long)pvVar3 + 8);
  lVar5 = *(long *)((long)pvVar3 + 0x10);
  lVar6 = *(long *)((long)pvVar3 + 0x18);
  lVar7 = *(long *)((long)pvVar3 + 0x20);
  dense_col = (float *)repfnz;
  pfStack_b0 = dense;
  tmp = (double)amax;
  *nseg = 0;
  piVar8 = Glu->xsup;
  piVar9 = Glu->supno;
  piVar10 = Glu->lsub;
  piVar11 = Glu->xlsub;
  marker1._4_4_ = jcol;
  do {
    if (jcol + w <= marker1._4_4_) {
      return;
    }
    xsup._4_4_ = (marker1._4_4_ - jcol) * m;
    *(undefined4 *)tmp = 0;
    for (local_90 = *(int *)(lVar6 + (long)marker1._4_4_ * 4);
        local_90 < *(int *)(lVar7 + (long)marker1._4_4_ * 4); local_90 = local_90 + 1) {
      iVar1 = *(int *)(lVar5 + (long)local_90 * 4);
      fVar2 = ABS(*(float *)(lVar4 + (long)local_90 * 4));
      if (*(float *)tmp < fVar2) {
        *(float *)tmp = fVar2;
      }
      pfStack_b0[iVar1] = *(float *)(lVar4 + (long)local_90 * 4);
      if (marker[iVar1] != marker1._4_4_) {
        marker[iVar1] = marker1._4_4_;
        fVar2 = (float)perm_r[iVar1];
        if (fVar2 == -NAN) {
          panel_lsub[xsup._4_4_] = iVar1;
          xsup._4_4_ = xsup._4_4_ + 1;
        }
        else {
          iVar1 = piVar8[piVar9[(int)fVar2] + 1];
          chmark = iVar1 + -1;
          if (dense_col[chmark] == -NAN) {
            parent[chmark] = -1;
            dense_col[chmark] = fVar2;
            k = piVar11[piVar8[piVar9[chmark]]];
            jj = piVar11[iVar1];
            do {
              while (k < jj) {
                iVar1 = piVar10[k];
                k = k + 1;
                if (marker[iVar1] != marker1._4_4_) {
                  marker[iVar1] = marker1._4_4_;
                  fVar2 = (float)perm_r[iVar1];
                  if (fVar2 == -NAN) {
                    panel_lsub[xsup._4_4_] = iVar1;
                    xsup._4_4_ = xsup._4_4_ + 1;
                  }
                  else {
                    iVar1 = piVar8[piVar9[(int)fVar2] + 1];
                    iVar12 = iVar1 + -1;
                    if (dense_col[iVar12] == -NAN) {
                      xplore[chmark] = k;
                      parent[iVar12] = chmark;
                      dense_col[iVar12] = fVar2;
                      k = piVar11[piVar8[piVar9[iVar12]]];
                      jj = piVar11[iVar1];
                      chmark = iVar12;
                    }
                    else if ((int)fVar2 < (int)dense_col[iVar12]) {
                      dense_col[iVar12] = fVar2;
                    }
                  }
                }
              }
              if (marker[(long)m + (long)chmark] < jcol) {
                segrep[*nseg] = chmark;
                *nseg = *nseg + 1;
                marker[(long)m + (long)chmark] = marker1._4_4_;
              }
              chmark = parent[chmark];
              if (chmark == -1) break;
              k = xplore[chmark];
              jj = piVar11[chmark + 1];
            } while (chmark != -1);
          }
          else if ((int)fVar2 < (int)dense_col[chmark]) {
            dense_col[chmark] = fVar2;
          }
        }
      }
    }
    dense_col = dense_col + m;
    pfStack_b0 = pfStack_b0 + m;
    tmp = (double)((long)tmp + 4);
    marker1._4_4_ = marker1._4_4_ + 1;
  } while( true );
}

Assistant:

void
ilu_spanel_dfs(
   const int  m,	   /* in - number of rows in the matrix */
   const int  w,	   /* in */
   const int  jcol,	   /* in */
   SuperMatrix *A,	   /* in - original matrix */
   int	      *perm_r,	   /* in */
   int	      *nseg,	   /* out */
   float     *dense,	   /* out */
   float     *amax,	   /* out - max. abs. value of each column in panel */
   int	      *panel_lsub, /* out */
   int	      *segrep,	   /* out */
   int	      *repfnz,	   /* out */
   int	      *marker,	   /* out */
   int	      *parent,	   /* working array */
   int_t      *xplore,	   /* working array */
   GlobalLU_t *Glu	   /* modified */
)
{

    NCPformat *Astore;
    float    *a;
    int_t     *asub;
    int_t     *xa_begin, *xa_end;
    int       krep, chperm, chmark, chrep, oldrep, kchild, myfnz;
    int       krow, kmark, kperm, kpar;
    int_t     xdfs, maxdfs, k;
    int       jj;	   /* index through each column in the panel */
    int       *marker1;    /* marker1[jj] >= jcol if vertex jj was visited
			      by a previous column within this panel. */
    int       *repfnz_col; /* start of each column in the panel */
    float    *dense_col;  /* start of each column in the panel */
    int_t     nextl_col;   /* next available position in panel_lsub[*,jj] */
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    float    *amax_col;
    register double tmp;

    /* Initialize pointers */
    Astore     = A->Store;
    a	       = Astore->nzval;
    asub       = Astore->rowind;
    xa_begin   = Astore->colbeg;
    xa_end     = Astore->colend;
    marker1    = marker + m;
    repfnz_col = repfnz;
    dense_col  = dense;
    amax_col   = amax;
    *nseg      = 0;
    xsup       = Glu->xsup;
    supno      = Glu->supno;
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;

    /* For each column in the panel */
    for (jj = jcol; jj < jcol + w; jj++) {
	nextl_col = (jj - jcol) * m;

#ifdef CHK_DFS
	printf("\npanel col %d: ", jj);
#endif

	*amax_col = 0.0;
	/* For each nonz in A[*,jj] do dfs */
	for (k = xa_begin[jj]; k < xa_end[jj]; k++) {
	    krow = asub[k];
	    tmp = fabs(a[k]);
	    if (tmp > *amax_col) *amax_col = tmp;
	    dense_col[krow] = a[k];
	    kmark = marker[krow];
	    if ( kmark == jj )
		continue;     /* krow visited before, go to the next nonzero */

	    /* For each unmarked nbr krow of jj
	     * krow is in L: place it in structure of L[*,jj]
	     */
	    marker[krow] = jj;
	    kperm = perm_r[krow];

	    if ( kperm == SLU_EMPTY ) {
		panel_lsub[nextl_col++] = krow; /* krow is indexed into A */
	    }
	    /*
	     * krow is in U: if its supernode-rep krep
	     * has been explored, update repfnz[*]
	     */
	    else {
		
		krep = xsup[supno[kperm]+1] - 1;
		myfnz = repfnz_col[krep];
		
#ifdef CHK_DFS
		printf("krep %d, myfnz %d, perm_r[%d] %d\n", krep, myfnz, krow, kperm);
#endif
		if ( myfnz != SLU_EMPTY ) { /* Representative visited before */
		    if ( myfnz > kperm ) repfnz_col[krep] = kperm;
		    /* continue; */
		}
		else {
		    /* Otherwise, perform dfs starting at krep */
		    oldrep = SLU_EMPTY;
		    parent[krep] = oldrep;
		    repfnz_col[krep] = kperm;
		    xdfs = xlsub[xsup[supno[krep]]];
		    maxdfs = xlsub[krep + 1];

#ifdef CHK_DFS
		    printf("  xdfs %d, maxdfs %d: ", xdfs, maxdfs);
		    for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);
		    printf("\n");
#endif
		    do {
			/*
			 * For each unmarked kchild of krep
			 */
			while ( xdfs < maxdfs ) {

			    kchild = lsub[xdfs];
			    xdfs++;
			    chmark = marker[kchild];

			    if ( chmark != jj ) { /* Not reached yet */
				marker[kchild] = jj;
				chperm = perm_r[kchild];

				/* Case kchild is in L: place it in L[*,j] */
				if ( chperm == SLU_EMPTY ) {
				    panel_lsub[nextl_col++] = kchild;
				}
				/* Case kchild is in U:
				 *   chrep = its supernode-rep. If its rep has
				 *   been explored, update its repfnz[*]
				 */
				else {
				    
				    chrep = xsup[supno[chperm]+1] - 1;
				    myfnz = repfnz_col[chrep];
#ifdef CHK_DFS
				    printf("chrep %d,myfnz %d,perm_r[%d] %d\n",chrep,myfnz,kchild,chperm);
#endif
				    if ( myfnz != SLU_EMPTY ) { /* Visited before */
					if ( myfnz > chperm )
					    repfnz_col[chrep] = chperm;
				    }
				    else {
					/* Cont. dfs at snode-rep of kchild */
					xplore[krep] = xdfs;
					oldrep = krep;
					krep = chrep; /* Go deeper down G(L) */
					parent[krep] = oldrep;
					repfnz_col[krep] = chperm;
					xdfs = xlsub[xsup[supno[krep]]];
					maxdfs = xlsub[krep + 1];
#ifdef CHK_DFS
					printf("  xdfs %d, maxdfs %d: ", xdfs, maxdfs);
					for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);
					printf("\n");
#endif
				    } /* else */

				} /* else */

			    } /* if... */

			} /* while xdfs < maxdfs */

			/* krow has no more unexplored nbrs:
			 *    Place snode-rep krep in postorder DFS, if this
			 *    segment is seen for the first time. (Note that
			 *    "repfnz[krep]" may change later.)
			 *    Backtrack dfs to its parent.
			 */
			if ( marker1[krep] < jcol ) {
			    segrep[*nseg] = krep;
			    ++(*nseg);
			    marker1[krep] = jj;
			}

			kpar = parent[krep]; /* Pop stack, mimic recursion */
			if ( kpar == SLU_EMPTY ) break; /* dfs done */
			krep = kpar;
			xdfs = xplore[krep];
			maxdfs = xlsub[krep + 1];

#ifdef CHK_DFS
			printf("  pop stack: krep %d,xdfs %d,maxdfs %d: ", krep,xdfs,maxdfs);
			for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);
			printf("\n");
#endif
		    } while ( kpar != SLU_EMPTY ); /* do-while - until empty stack */

		} /* else */
		
	    } /* else */

	} /* for each nonz in A[*,jj] */

	repfnz_col += m;    /* Move to next column */
	dense_col += m;
	amax_col++;

    } /* for jj ... */

}